

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Reg2U(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint index)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0_00;
  RegSlot RVar3;
  undefined4 *puVar4;
  RegSlot local_40;
  RegSlot local_3c;
  uint local_38;
  RegSlot local_34;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  local_34 = R1;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8e1,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_008a2307;
    *puVar4 = 0;
  }
  RVar3 = local_34;
  CheckOp(this,op,(OpLayoutType)0xc);
  CheckOpen(this);
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008a2307;
      *puVar4 = 0;
      RVar3 = local_34;
    }
    R0_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (RVar3 != 0xffffffff) {
      if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_008a2231:
        RVar3 = FunctionBody::MapRegSlot(this->m_functionWrite,RVar3);
        bVar2 = TryWriteReg2U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,R0_00,RVar3,index);
        if (!bVar2) {
          bVar2 = TryWriteReg2U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00,RVar3,index);
          if (!bVar2) {
            local_40 = R0_00;
            local_3c = RVar3;
            local_38 = index;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar2) {
        *puVar4 = 0;
        RVar3 = local_34;
        goto LAB_008a2231;
      }
      goto LAB_008a2307;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_008a2307:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg2U(OpCode op, RegSlot R0, RegSlot R1, uint index)
    {
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckOp(op, OpLayoutType::Reg2U);
        CheckOpen();

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(Reg2U, op, R0, R1, index);
    }